

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall
ClipperLib::PolyOffsetBuilder::PolyOffsetBuilder
          (PolyOffsetBuilder *this,Polygons *in_polys,Polygons *out_polys,double delta,
          JoinType jointype,double MiterLimit)

{
  pointer pvVar1;
  long *plVar2;
  pointer pDVar3;
  IntPoint *pt2;
  long lVar4;
  double dVar5;
  bool bVar6;
  ulong uVar7;
  ulong __new_size;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  DoublePoint DVar11;
  allocator_type local_171;
  double local_170;
  undefined1 local_168 [16];
  vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_> *local_158;
  Polygons *local_150;
  undefined1 local_148 [16];
  IntRect r;
  Polygon outer;
  Clipper clpr;
  
  (this->m_p).
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_p).
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_p).
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158 = &this->normals;
  (this->normals).
  super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->normals).
  super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->normals).
  super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168._8_4_ = in_XMM0_Dc;
  local_168._0_8_ = delta;
  local_168._12_4_ = in_XMM0_Dd;
  local_170 = MiterLimit;
  if (1e-20 <= ABS(delta)) {
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::operator=(&this->m_p,in_polys);
    this->m_delta = (double)local_168._0_8_;
    this->m_jointype = jointype;
    uVar9 = 0;
    uVar10 = 0x3ff00000;
    if (1.0 <= local_170) {
      uVar9 = SUB84(local_170,0);
      uVar10 = (undefined4)((ulong)local_170 >> 0x20);
    }
    local_170 = (double)CONCAT44(uVar10,uVar9);
    this->m_RMin = 2.0 / ((double)CONCAT44(uVar10,uVar9) * (double)CONCAT44(uVar10,uVar9));
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::clear(out_polys);
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::resize(out_polys,
             ((long)(in_polys->
                    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(in_polys->
                   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18);
    local_148._8_4_ = local_168._8_4_;
    local_148._0_8_ = local_168._0_8_ * local_168._0_8_ * 3.141592653589793;
    local_148._12_4_ = local_168._12_4_;
    uVar7 = 0;
    local_150 = out_polys;
    while (this->m_i = uVar7,
          uVar7 < (ulong)(((long)(in_polys->
                                 super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(in_polys->
                                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
      this->m_curr_poly =
           (out_polys->
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + uVar7;
      pvVar1 = (in_polys->
               super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      __new_size = (long)*(pointer *)
                          ((long)&pvVar1[uVar7].
                                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                  ._M_impl.super__Vector_impl_data + 8) -
                   *(long *)&pvVar1[uVar7].
                             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                             ._M_impl.super__Vector_impl_data >> 4;
      if (1 < __new_size) {
        plVar2 = *(long **)&(this->m_p).
                            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar7].
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl;
        uVar8 = __new_size - 1;
        if ((*plVar2 == plVar2[uVar8 * 2]) && (plVar2[1] == plVar2[uVar8 * 2 + 1])) {
          __new_size = uVar8;
        }
      }
      dVar5 = Area(pvVar1 + uVar7);
      if (0.0 <= (double)local_168._0_8_) {
        if ((0.0 <= dVar5) || ((double)local_148._0_8_ <= -dVar5)) goto LAB_0058903d;
      }
      else if ((double)local_148._0_8_ <= dVar5 || dVar5 <= 0.0) {
LAB_0058903d:
        if ((__new_size != 0) && ((0.0 < (double)local_168._0_8_ || (2 < __new_size)))) {
          if (__new_size == 1) {
            clpr._vptr_Clipper = (_func_int **)0x0;
            clpr.m_PolyOuts.
            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            clpr.m_PolyOuts.
            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            BuildArc((Polygon *)&r,
                     (in_polys->
                     super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[this->m_i].
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_start,0.0,6.283185307179586,
                     (double)local_168._0_8_);
            std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::_M_move_assign
                      ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&clpr,
                       &r);
            std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
            ~_Vector_base((_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           *)&r);
            std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator=
                      ((out_polys->
                       super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + this->m_i,
                       (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&clpr)
            ;
            std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
            ~_Vector_base((_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           *)&clpr);
          }
          else {
            pDVar3 = (this->normals).
                     super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((this->normals).
                super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                ._M_impl.super__Vector_impl_data._M_finish != pDVar3) {
              (this->normals).
              super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
              _M_impl.super__Vector_impl_data._M_finish = pDVar3;
            }
            std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::resize
                      (local_158,__new_size);
            uVar7 = __new_size - 1;
            pt2 = (in_polys->
                  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[this->m_i].
                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                  _M_impl.super__Vector_impl_data._M_start;
            DVar11 = GetUnitNormal(pt2 + uVar7,pt2);
            pDVar3 = (this->normals).
                     super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pDVar3[uVar7].X = DVar11.X;
            pDVar3[uVar7].Y = DVar11.Y;
            uVar8 = 0;
            while (out_polys = local_150, this->m_j = uVar8, uVar8 < uVar7) {
              lVar4 = *(long *)&(in_polys->
                                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[this->m_i].
                                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                ._M_impl.super__Vector_impl_data;
              DVar11 = GetUnitNormal((IntPoint *)(lVar4 + uVar8 * 0x10),
                                     (IntPoint *)(lVar4 + uVar8 * 0x10 + 0x10));
              pDVar3 = (this->normals).
                       super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pDVar3[uVar8].X = DVar11.X;
              pDVar3[uVar8].Y = DVar11.Y;
              uVar8 = this->m_j + 1;
            }
            this->m_k = uVar7;
            uVar8 = 0;
            while (this->m_j = uVar8, uVar8 < __new_size) {
              uVar9 = 0;
              uVar10 = 0x3ff00000;
              if (jointype == jtSquare) {
LAB_005891e3:
                DoSquare(this,(double)CONCAT44(uVar10,uVar9));
              }
              else if (jointype == jtRound) {
                DoRound(this);
              }
              else if (jointype == jtMiter) {
                pDVar3 = (this->normals).
                         super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                dVar5 = pDVar3[uVar8].X * pDVar3[uVar7].X + pDVar3[uVar8].Y * pDVar3[uVar7].Y + 1.0;
                this->m_R = dVar5;
                uVar9 = SUB84(local_170,0);
                uVar10 = (undefined4)((ulong)local_170 >> 0x20);
                if (dVar5 < this->m_RMin) goto LAB_005891e3;
                DoMiter(this);
              }
              uVar7 = this->m_j;
              this->m_k = uVar7;
              uVar8 = uVar7 + 1;
            }
          }
        }
      }
      uVar7 = this->m_i + 1;
    }
    clpr._184_8_ = 0;
    clpr._168_8_ = 0;
    clpr._176_8_ = 0;
    clpr._144_8_ = 0;
    clpr._152_8_ = 0;
    clpr._vptr_Clipper = (_func_int **)&PTR__Clipper_0082cfd8;
    clpr._136_8_ = &PTR__Clipper_0082d028;
    clpr._160_1_ = 0;
    clpr.m_ReverseOutput = false;
    clpr.m_PolyOuts.super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    clpr.m_PolyOuts.super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    clpr.m_PolyOuts.super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    clpr.m_Joins.super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    clpr.m_Joins.super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    clpr.m_Joins.super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    clpr.m_HorizJoins.
    super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    clpr.m_HorizJoins.
    super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    clpr.m_HorizJoins.
    super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    clpr.m_Scanbeam = (Scanbeam *)0x0;
    clpr.m_ActiveEdges = (TEdge *)0x0;
    clpr.m_SortedEdges = (TEdge *)0x0;
    clpr.m_IntersectNodes = (IntersectNode *)0x0;
    clpr.m_ExecuteLocked = false;
    ClipperBase::AddPolygons((ClipperBase *)&clpr.field_0x88,out_polys,ptSubject);
    if ((double)local_168._0_8_ <= 0.0) {
      ClipperBase::GetBounds(&r,(ClipperBase *)(clpr._vptr_Clipper[-3] + (long)&clpr));
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                (&outer,4,&local_171);
      (outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
       .super__Vector_impl_data._M_start)->X = r.left + -10;
      (outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
       .super__Vector_impl_data._M_start)->Y = r.bottom + 10;
      outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_start[1].X = r.right + 10;
      outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_start[1].Y = r.bottom + 10;
      outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_start[2].X = r.right + 10;
      outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_start[2].Y = r.top + -10;
      outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_start[3].X = r.left + -10;
      outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_start[3].Y = r.top + -10;
      ClipperBase::AddPolygon
                ((ClipperBase *)(clpr._vptr_Clipper[-3] + (long)&clpr._vptr_Clipper),&outer,
                 ptSubject);
      bVar6 = Clipper::Execute(&clpr,ctUnion,out_polys,pftNegative,pftNegative);
      if (bVar6) {
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::erase(out_polys,
                (out_polys->
                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start);
        ReversePolygons(out_polys);
      }
      else {
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::clear(out_polys);
      }
      std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
                (&outer.
                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>);
    }
    else {
      bVar6 = Clipper::Execute(&clpr,ctUnion,out_polys,pftPositive,pftPositive);
      if (!bVar6) {
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::clear(out_polys);
      }
    }
    Clipper::~Clipper(&clpr);
  }
  else {
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::operator=(out_polys,in_polys);
  }
  return;
}

Assistant:

PolyOffsetBuilder(const Polygons& in_polys, Polygons& out_polys,
  double delta, JoinType jointype, double MiterLimit)
{
    //nb precondition - out_polys != ptsin_polys
    if (NEAR_ZERO(delta))
    {
        out_polys = in_polys;
        return;
    }

    this->m_p = in_polys;
    this->m_delta = delta;
    this->m_jointype = jointype;
    if (MiterLimit <= 1) MiterLimit = 1;
    m_RMin = 2/(MiterLimit*MiterLimit);
 
    double deltaSq = delta*delta;
    out_polys.clear();
    out_polys.resize(in_polys.size());
    for (m_i = 0; m_i < in_polys.size(); m_i++)
    {
        m_curr_poly = &out_polys[m_i];
        size_t len = in_polys[m_i].size();
        if (len > 1 && m_p[m_i][0].X == m_p[m_i][len - 1].X &&
            m_p[m_i][0].Y == m_p[m_i][len-1].Y) len--;

        //when 'shrinking' polygons - to minimize artefacts
        //strip those polygons that have an area < pi * delta^2 ...
        double a1 = Area(in_polys[m_i]);
        if (delta < 0) { if (a1 > 0 && a1 < deltaSq *pi) len = 0; }
        else if (a1 < 0 && -a1 < deltaSq *pi) len = 0; //holes have neg. area

        if (len == 0 || (len < 3 && delta <= 0))
          continue;
        else if (len == 1)
        {
            Polygon arc;
            arc = BuildArc(in_polys[m_i][len-1], 0, 2 * pi, delta);
            out_polys[m_i] = arc;
            continue;
        }

        //build normals ...
        normals.clear();
        normals.resize(len);
        normals[len-1] = GetUnitNormal(in_polys[m_i][len-1], in_polys[m_i][0]);
        for (m_j = 0; m_j < len -1; ++m_j)
            normals[m_j] = GetUnitNormal(in_polys[m_i][m_j], in_polys[m_i][m_j+1]);
        
        m_k = len -1;
        for (m_j = 0; m_j < len; ++m_j)
        {
          switch (jointype)
          {
            case jtMiter:
            {
              m_R = 1 + (normals[m_j].X*normals[m_k].X + 
                normals[m_j].Y*normals[m_k].Y);
              if (m_R >= m_RMin) DoMiter(); else DoSquare(MiterLimit);
              break;
            }
            case jtSquare: DoSquare(); break;
            case jtRound: DoRound(); break;
          }
        m_k = m_j;
        }
    }

    //finally, clean up untidy corners using Clipper ...
    Clipper clpr;
    clpr.AddPolygons(out_polys, ptSubject);
    if (delta > 0)
    {
        if (!clpr.Execute(ctUnion, out_polys, pftPositive, pftPositive))
            out_polys.clear();
    }
    else
    {
        IntRect r = clpr.GetBounds();
        Polygon outer(4);
        outer[0] = IntPoint(r.left - 10, r.bottom + 10);
        outer[1] = IntPoint(r.right + 10, r.bottom + 10);
        outer[2] = IntPoint(r.right + 10, r.top - 10);
        outer[3] = IntPoint(r.left - 10, r.top - 10);

        clpr.AddPolygon(outer, ptSubject);
        if (clpr.Execute(ctUnion, out_polys, pftNegative, pftNegative))
        {
            out_polys.erase(out_polys.begin());
            ReversePolygons(out_polys);

        } else
            out_polys.clear();
    }
}